

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taggedptr.h
# Opt level: O0

string * pbrt::detail::
         DispatchCPU<pbrt::Shape::ToString[abi:cxx11]()const::__0&,std::__cxx11::string,pbrt::Sphere,pbrt::Cylinder,pbrt::Disk,pbrt::Triangle,pbrt::BilinearPatch,pbrt::Curve>
                   (anon_class_1_0_00000001 *func,void *ptr,int index)

{
  undefined4 in_ECX;
  string *in_RDI;
  
  switch(in_ECX) {
  case 0:
    const::$_0::operator()((anon_class_1_0_00000001 *)in_RDI,(Sphere *)in_RDI);
    break;
  case 1:
    const::$_0::operator()((anon_class_1_0_00000001 *)in_RDI,(Cylinder *)in_RDI);
    break;
  case 2:
    const::$_0::operator()((anon_class_1_0_00000001 *)in_RDI,(Disk *)in_RDI);
    break;
  case 3:
    const::$_0::operator()((anon_class_1_0_00000001 *)in_RDI,(Triangle *)in_RDI);
    break;
  case 4:
    const::$_0::operator()((anon_class_1_0_00000001 *)in_RDI,(BilinearPatch *)in_RDI);
    break;
  default:
    const::$_0::operator()((anon_class_1_0_00000001 *)in_RDI,(Curve *)in_RDI);
  }
  return in_RDI;
}

Assistant:

auto DispatchCPU(F &&func, const void *ptr, int index) {
    DCHECK_GE(index, 0);
    DCHECK_LT(index, 6);

    switch (index) {
    case 0:
        return func((const T0 *)ptr);
    case 1:
        return func((const T1 *)ptr);
    case 2:
        return func((const T2 *)ptr);
    case 3:
        return func((const T3 *)ptr);
    case 4:
        return func((const T4 *)ptr);
    default:
        return func((const T5 *)ptr);
    }
}